

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_lda_inc.c
# Opt level: O1

void work_lda_vxc_unpol(xc_func_type *p,size_t np,double *rho,xc_lda_out_params *out)

{
  double __x;
  double *pdVar1;
  long lVar2;
  size_t sVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double __x_00;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  double dVar21;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  undefined1 auVar28 [16];
  double dVar22;
  double dVar23;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  double dVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double local_170;
  
  if (np != 0) {
    sVar3 = 0;
    do {
      if (p->nspin == 2) {
        lVar2 = (long)(p->dim).rho * sVar3;
        dVar4 = rho[lVar2] + rho[lVar2 + 1];
      }
      else {
        dVar4 = rho[(long)(p->dim).rho * sVar3];
      }
      dVar9 = p->dens_threshold;
      if (dVar9 <= dVar4) {
        __x = rho[(long)(p->dim).rho * sVar3];
        dVar5 = cbrt(0.3183098861837907);
        dVar6 = dVar5 * 1.4422495703074083;
        dVar7 = dVar6 * 2.519842099789747;
        dVar4 = p->zeta_threshold;
        dVar20 = 1.0;
        dVar8 = 1.0;
        if (1.0 <= dVar4) {
          dVar8 = cbrt(dVar4);
          dVar20 = dVar4 * dVar8;
        }
        if (__x <= dVar9) {
          __x = dVar9;
        }
        dVar21 = dVar20 * 1.5874010519681996;
        dVar9 = cbrt(__x);
        dVar4 = cbrt(9.0);
        dVar31 = p->cam_omega * dVar5 * dVar5 * dVar4 * dVar4;
        auVar28._8_8_ = dVar9;
        auVar28._0_8_ = dVar8;
        auVar28 = divpd(_DAT_00f70e00,auVar28);
        dVar8 = auVar28._8_8_;
        dVar22 = (auVar28._0_8_ * dVar8 * 1.4422495703074083 * dVar31) / 18.0;
        dVar4 = 1.92;
        if (dVar22 <= 1.92) {
          dVar4 = dVar22;
        }
        dVar10 = atan2(1.0,dVar4);
        dVar23 = dVar4 * dVar4;
        dVar11 = 1.0 / dVar23 + 1.0;
        dVar12 = log(dVar11);
        dVar45 = dVar22;
        if (dVar22 <= 1.92) {
          dVar45 = 1.92;
        }
        dVar46 = dVar45 * dVar45;
        dVar47 = dVar46 * dVar46;
        dVar48 = dVar47 * dVar47;
        dVar32 = dVar48 * dVar48;
        dVar44 = 1.0 / dVar32;
        dVar43 = 1.0 / (dVar32 * dVar32);
        dVar32 = 1.0 - dVar12 * (dVar23 + 3.0);
        dVar10 = dVar4 * dVar32 * 0.25 + dVar10;
        if (dVar22 < 1.92) {
          local_170 = dVar10 * -2.6666666666666665 * dVar4 + 1.0;
        }
        else {
          auVar18._0_8_ = dVar46 * dVar47;
          auVar30._8_8_ = dVar44;
          auVar30._0_8_ = dVar44;
          auVar41._8_8_ = dVar44;
          auVar41._0_8_ = dVar44;
          auVar42._8_8_ = dVar44;
          auVar42._0_8_ = dVar44;
          auVar29._8_8_ = dVar48 * dVar47;
          auVar29._0_8_ = dVar46 * dVar48;
          auVar29 = divpd(auVar30,auVar29);
          auVar37._0_8_ = 1.0 / (dVar48 * auVar18._0_8_);
          auVar37._8_8_ = dVar44;
          auVar37 = divpd(auVar37,_DAT_00f8a370);
          auVar38._8_8_ = dVar47;
          auVar38._0_8_ = dVar46;
          auVar40 = divpd(auVar41,auVar38);
          auVar41 = divpd(auVar40,_DAT_00f8a380);
          auVar18._8_8_ = dVar48;
          auVar40 = divpd(auVar42,auVar18);
          auVar42 = divpd(auVar40,_DAT_00f8a390);
          auVar30 = divpd(auVar29,_DAT_00f8a3a0);
          auVar40._0_8_ = dVar44 / (dVar48 * auVar18._0_8_);
          auVar40._8_8_ = dVar43;
          auVar29 = divpd(auVar40,_DAT_00f8a3b0);
          auVar19._8_8_ = dVar43;
          auVar19._0_8_ = dVar43;
          auVar40 = divpd(auVar19,auVar38);
          auVar40 = divpd(auVar40,_DAT_00f8a3c0);
          local_170 = ((((((((((((1.0 / (dVar48 * dVar47)) / -364.0 +
                                 (1.0 / (dVar46 * dVar48)) / 231.0 +
                                 (1.0 / dVar48) / -135.0 +
                                 (1.0 / auVar18._0_8_) / 70.0 +
                                 (1.0 / dVar47) / -30.0 + (1.0 / dVar46) / 9.0 + auVar37._0_8_) -
                               auVar37._8_8_) + auVar41._0_8_) - auVar41._8_8_) + auVar42._0_8_) -
                           auVar42._8_8_) + auVar30._0_8_) - auVar30._8_8_) + auVar29._0_8_) -
                       auVar29._8_8_) + auVar40._0_8_) - auVar40._8_8_;
        }
        dVar24 = dVar8 * 2.519842099789747 * dVar6;
        dVar13 = dVar24 * 0.053425 + 1.0;
        dVar14 = SQRT(dVar24);
        dVar15 = dVar14;
        if (dVar24 < 0.0) {
          dVar15 = sqrt(dVar24);
          dVar14 = sqrt(dVar24);
        }
        dVar25 = dVar5 * dVar5 * 2.080083823051904;
        dVar33 = 1.0 / (dVar9 * dVar9);
        dVar34 = dVar33 * 1.5874010519681996 * dVar25;
        dVar26 = dVar34 * 0.123235 + dVar14 * dVar24 * 0.204775 + dVar15 * 3.79785 + dVar24 * 0.8969
        ;
        __x_00 = 16.081979498692537 / dVar26 + 1.0;
        dVar16 = log(__x_00);
        dVar20 = (dVar20 + dVar20 + -2.0) * 1.9236610509315362;
        dVar35 = dVar24 * 0.0278125 + 1.0;
        dVar27 = dVar34 * 0.1241775 +
                 dVar14 * dVar24 * 0.1100325 + dVar15 * 5.1785 + dVar24 * 0.905775;
        dVar14 = 29.608749977793437 / dVar27 + 1.0;
        dVar17 = log(dVar14);
        dVar36 = dVar16 * -0.0621814 * dVar13 + dVar17 * 0.0197516734986138 * dVar35 * dVar20;
        dVar39 = dVar34 * 0.25 + dVar24 * -0.225 + 3.2;
        dVar34 = local_170 * -0.1875 * dVar9 * dVar21 * dVar7 + (1.0 / dVar39) * 3.4602 * dVar36;
        pdVar1 = out->zk;
        if ((pdVar1 != (double *)0x0) && ((p->info->flags & 1) != 0)) {
          lVar2 = (long)(p->dim).zk * sVar3;
          pdVar1[lVar2] = pdVar1[lVar2] + dVar34;
        }
        dVar8 = dVar8 / __x;
        dVar31 = (dVar31 * auVar28._0_8_ * dVar8 * 1.4422495703074083) / -54.0;
        if (dVar22 < 1.92) {
          dVar11 = 1.0 / dVar11;
          dVar31 = (double)(~-(ulong)(1.92 < dVar22) & (ulong)dVar31);
          dVar22 = dVar11 * dVar31;
          dVar4 = dVar10 * -2.6666666666666665 * dVar31 +
                  ((dVar12 * -2.0 * dVar31 * dVar4 +
                   (dVar23 + 3.0) * (1.0 / (dVar23 * dVar4)) * (dVar22 + dVar22)) * dVar4 * 0.25 +
                  (dVar32 * dVar31 * 0.25 - (1.0 / dVar23) * dVar11 * dVar31)) * -2.6666666666666665
                  * dVar4;
        }
        else {
          dVar31 = (double)(-(ulong)(1.92 < dVar22) & (ulong)dVar31);
          dVar4 = dVar45 * dVar47;
          dVar46 = dVar46 * dVar45;
          dVar47 = dVar47 * dVar46;
          dVar4 = (1.0 / dVar4) * dVar31 * 0.13333333333333333 +
                  (1.0 / dVar46) * dVar31 * -0.2222222222222222 +
                  (1.0 / dVar47) * dVar31 * -0.08571428571428572 +
                  (1.0 / (dVar48 * dVar45)) * dVar31 * 0.05925925925925926 +
                  (1.0 / (dVar46 * dVar48)) * dVar31 * -0.04329004329004329 +
                  (1.0 / (dVar48 * dVar4)) * dVar31 * 0.03296703296703297 +
                  (1.0 / (dVar48 * dVar47)) * dVar31 * -0.025925925925925925 +
                  (dVar44 / dVar45) * dVar31 * 0.02091503267973856 +
                  (dVar44 / dVar46) * dVar31 * -0.01722488038277512 +
                  (dVar44 / dVar4) * dVar31 * 0.01443001443001443 +
                  (dVar44 / dVar47) * dVar31 * -0.012263099219620958 +
                  (dVar44 / (dVar48 * dVar45)) * dVar31 * 0.01054945054945055 +
                  (dVar44 / (dVar46 * dVar48)) * dVar31 * -0.009171075837742505 +
                  (dVar44 / (dVar48 * dVar4)) * dVar31 * 0.008045977011494253 +
                  (dVar44 / (dVar48 * dVar47)) * dVar31 * -0.007115749525616698 +
                  (dVar43 / dVar45) * dVar31 * 0.006337888690829867 +
                  (dVar43 / dVar46) * dVar31 * -0.0056808688387635755 +
                  (dVar43 / dVar4) * dVar31 * 0.005120910384068279;
        }
        dVar45 = dVar5 * 2.519842099789747 * dVar8;
        dVar31 = (1.4422495703074083 / dVar15) * dVar45;
        dVar22 = dVar6 * dVar8 * 2.519842099789747;
        if (dVar24 < 0.0) {
          dVar24 = sqrt(dVar24);
        }
        else {
          dVar24 = SQRT(dVar24);
        }
        dVar45 = dVar45 * dVar24 * 1.4422495703074083;
        dVar25 = dVar25 * (dVar33 / __x) * 1.5874010519681996;
        pdVar1 = out->vrho;
        if ((pdVar1 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
          lVar2 = (long)(p->dim).vrho * sVar3;
          pdVar1[lVar2] =
               ((dVar22 * 0.075 + dVar25 / -6.0) * (1.0 / (dVar39 * dVar39)) * dVar36 * -3.4602 +
               (1.0 / dVar39) *
               ((1.0 / dVar14) *
                (dVar25 * -0.082785 +
                dVar45 * -0.05501625 + dVar31 * -0.8630833333333333 + dVar22 * -0.301925) *
                (1.0 / (dVar27 * dVar27)) * -0.5848223622634646 * dVar35 * dVar20 +
               dVar5 * 2.519842099789747 * dVar8 * dVar17 * -0.00018311447306006544 *
               dVar20 * 1.4422495703074083 +
               dVar8 * 2.519842099789747 * dVar16 * 0.0011073470983333333 * dVar6 +
               dVar13 * (1.0 / (dVar26 * dVar26)) *
               (1.0 / __x_00) *
               (dVar25 * -0.08215666666666667 +
               dVar45 * -0.1023875 + dVar31 * -0.632975 + dVar22 * -0.29896666666666666)) * 3.4602 +
               dVar9 * dVar4 * dVar21 * dVar7 * -0.1875 +
               dVar7 * dVar21 * local_170 * dVar33 * -0.0625) * __x + dVar34 + pdVar1[lVar2];
        }
      }
      sVar3 = sVar3 + 1;
    } while (np != sVar3);
  }
  return;
}

Assistant:

static void
WORK_LDA(ORDER_TXT, SPIN_TXT)
(const XC(func_type) *p, size_t np, const double *rho, xc_lda_out_params *out)
{

#ifdef XC_DEBUG
  /* This throws an exception when floating point errors are encountered */
  /*feenableexcept(FE_DIVBYZERO | FE_INVALID);*/
#endif

  size_t ip;
  double dens;
  double my_rho[2] = {0.0, 0.0};

  for(ip = 0; ip < np; ip++){
    /* Screen low density */
    dens = (p->nspin == XC_POLARIZED) ? VAR(rho, ip, 0) + VAR(rho, ip, 1) : VAR(rho, ip, 0);
    if(dens < p->dens_threshold)
      continue;
    
    /* sanity check of input parameters */
    my_rho[0] = m_max(p->dens_threshold, VAR(rho, ip, 0));
    if(p->nspin == XC_POLARIZED){
      my_rho[1] = m_max(p->dens_threshold, VAR(rho, ip, 1));
    }

    FUNC(ORDER_TXT, SPIN_TXT)(p, ip, my_rho, out);

    /* check for NaNs */
#ifdef XC_DEBUG
    {
      const xc_dimensions *dim = &(p->dim);
      int ii, is_OK = 1;

      if(out->zk != NULL)
        is_OK = is_OK & isfinite(out->VAR(zk, ip, 0));

      if(out->vrho != NULL){
        for(ii=0; ii < dim->vrho; ii++)
          is_OK = is_OK && isfinite(out->VAR(vrho, ip, ii));
      }

      if(!is_OK){
        printf("Problem in the evaluation of the functional\n");
        if(p->nspin == XC_UNPOLARIZED){
          printf("./xc-get_data %d 1 %le 0.0 0.0 0.0 0.0 0.0 0.0 0.0 0.0\n",
                 p->info->number, VAR(rho, ip, 0));
        }else{
          printf("./xc-get_data %d 2 %le %le 0.0 0.0 0.0 0.0 0.0 0.0 0.0\n",
                 p->info->number, VAR(rho, ip, 0), VAR(rho, ip, 1));
        }
      }
    }
#endif
  }   /* for(ip) */

}